

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall
LinearScan::InsertSecondChanceCompensation
          (LinearScan *this,Lifetime **branchRegContent,Lifetime **labelRegContent,
          BranchInstr *branchInstr,LabelInstr *labelInstr)

{
  IRKind IVar1;
  uint uVar2;
  Func *lifetime;
  Func *lifetime_00;
  Lifetime *pLVar3;
  Lifetime *lifetime_01;
  bool bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  byte bVar7;
  uint32 uVar8;
  Instr *pIVar9;
  BranchInstr *this_00;
  Loop *loop;
  Loop *pLVar10;
  LabelInstr *pLVar11;
  LabelInstr *pLVar12;
  RegNum reg_00;
  long lVar13;
  RegNum reg;
  uint uVar14;
  Lifetime *local_198;
  Lifetime *tmpRegContent [33];
  BitVector _unit;
  LabelInstr *local_80;
  Instr *local_78;
  BitVector local_70;
  BitVector thrashedRegs;
  Instr *local_60;
  Instr *local_50;
  LabelInstr *local_48;
  bool local_32;
  bool local_31;
  
  thrashedRegs.word = (Type)labelRegContent;
  pIVar9 = IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
  bVar4 = IR::BranchInstr::IsConditional(branchInstr);
  local_31 = true;
  if (!bVar4) {
    if (pIVar9->m_kind == InstrKindBranch) {
      this_00 = IR::Instr::AsBranchInstr(pIVar9);
      bVar4 = IR::BranchInstr::IsConditional(this_00);
      if (bVar4) goto LAB_00537709;
    }
    local_31 = IR::BranchInstr::IsMultiBranch(branchInstr);
  }
LAB_00537709:
  local_32 = false;
  local_78 = (branchInstr->super_Instr).m_prev;
  local_70.word = 0;
  local_80 = (LabelInstr *)branchInstr;
  if (this->regContent == branchRegContent) {
    loop = IR::LabelInstr::GetLoop(labelInstr);
    js_memcpy_s(&local_198,0x108,this->regContent,0x108);
    AvoidCompensationConflicts
              (this,labelInstr,branchInstr,(Lifetime **)thrashedRegs.word,&local_198,
               (Instr **)&local_80,&local_78,local_31,&local_32);
    tmpRegContent[0x20] = (Lifetime *)(this->secondChanceRegs).word;
    lVar13 = 0;
    if (tmpRegContent[0x20] != (Lifetime *)0x0) {
      for (; ((ulong)tmpRegContent[0x20] >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
      }
    }
    local_48 = local_80;
    local_60 = local_78;
    bVar7 = local_32;
    while (uVar14 = -(uint)(tmpRegContent[0x20] == (Lifetime *)0x0) | (uint)lVar13,
          uVar14 != 0xffffffff) {
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)(tmpRegContent + 0x20),uVar14);
      pLVar3 = *(Lifetime **)(thrashedRegs.word + (ulong)uVar14 * 8);
      lifetime_01 = tmpRegContent[(ulong)uVar14 - 1];
      if (((lifetime_01 != (Lifetime *)0x0) &&
          (uVar2 = lifetime_01->start, uVar8 = IR::Instr::GetNumber(&labelInstr->super_Instr),
          uVar2 < uVar8)) &&
         (uVar2 = lifetime_01->lastAllocationStart,
         uVar8 = IR::Instr::GetNumber(&labelInstr->super_Instr), uVar8 < uVar2)) {
        pLVar10 = IR::LabelInstr::GetLoop(labelInstr);
        BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((pLVar10->regAlloc).liveOnBackEdgeSyms,(lifetime_01->sym->super_Sym).m_id
                          );
        if ((BVar6 != '\0') &&
           ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
            (lifetime_01->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next != &lifetime_01->defList)) {
          if ((local_31 != false) && ((bVar7 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_60 = (labelInstr->super_Instr).m_prev;
            bVar7 = 1;
            local_48 = labelInstr;
          }
          InsertStores(this,lifetime_01,lifetime_01->reg,local_60);
        }
      }
      if (lifetime_01 != pLVar3) {
        bVar4 = NeedsLoopBackEdgeCompensation(this,lifetime_01,labelInstr);
        reg_00 = (RegNum)uVar14;
        if (bVar4) {
          if ((local_31 != false) && ((bVar7 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_60 = (labelInstr->super_Instr).m_prev;
            bVar7 = 1;
            local_48 = labelInstr;
          }
          ReconcileRegContent(this,&local_198,(Lifetime **)thrashedRegs.word,branchInstr,labelInstr,
                              lifetime_01,reg_00,&local_70,&local_48->super_Instr,local_60);
        }
        if (((((pLVar3 != (Lifetime *)0x0) && ((pLVar3->field_0x9c & 1) != 0)) &&
             (bVar4 = StackSym::IsConst(pLVar3->sym), !bVar4)) &&
            ((uVar14 = pLVar3->end, uVar8 = IR::Instr::GetNumber(&branchInstr->super_Instr),
             uVar8 <= uVar14 &&
             (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                ((loop->regAlloc).liveOnBackEdgeSyms,(pLVar3->sym->super_Sym).m_id),
             BVar6 != '\0')))) &&
           (bVar4 = ClearLoopExitIfRegUnused(this,pLVar3,reg_00,branchInstr,loop), !bVar4)) {
          if ((local_31 != false) && ((bVar7 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_60 = (labelInstr->super_Instr).m_prev;
            bVar7 = 1;
            local_48 = labelInstr;
          }
          ReconcileRegContent(this,&local_198,(Lifetime **)thrashedRegs.word,branchInstr,labelInstr,
                              pLVar3,reg_00,&local_70,&local_48->super_Instr,local_60);
        }
      }
      lVar13 = 0;
      if (tmpRegContent[0x20] != (Lifetime *)0x0) {
        for (; ((ulong)tmpRegContent[0x20] >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
    }
    local_80 = local_48;
    local_78 = local_60;
    local_32 = (bool)bVar7;
    for (lVar13 = 1; lVar13 != 0x21; lVar13 = lVar13 + 1) {
      pLVar3 = *(Lifetime **)(thrashedRegs.word + lVar13 * 8);
      if ((((pLVar3 != (Lifetime *)0x0) && (bVar4 = StackSym::IsConst(pLVar3->sym), !bVar4)) &&
          (pLVar3 != tmpRegContent[lVar13 + -1])) &&
         ((BVar6 = BVUnitT<unsigned_long>::Test(&local_70,(BVIndex)lVar13), BVar6 == '\0' &&
          (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((loop->regAlloc).liveOnBackEdgeSyms,(pLVar3->sym->super_Sym).m_id),
          BVar6 != '\0')))) {
        bVar4 = ClearLoopExitIfRegUnused(this,pLVar3,(RegNum)lVar13,branchInstr,loop);
        if (!bVar4) {
          if ((local_31 != false) && ((bVar7 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_60 = (labelInstr->super_Instr).m_prev;
            bVar7 = 1;
            local_48 = labelInstr;
          }
          ReconcileRegContent(this,&local_198,(Lifetime **)thrashedRegs.word,branchInstr,labelInstr,
                              pLVar3,(RegNum)lVar13,&local_70,&local_48->super_Instr,local_60);
        }
      }
    }
    local_80 = local_48;
    local_78 = local_60;
    local_32 = (bool)bVar7;
    if ((bVar7 & 1) != 0) {
      (loop->regAlloc).hasAirLock = true;
    }
  }
  else {
    bVar4 = false;
    local_50 = local_78;
    local_48 = (LabelInstr *)branchInstr;
    for (lVar13 = 0x76; lVar13 != 0x96; lVar13 = lVar13 + 1) {
      lifetime = (Func *)branchRegContent[lVar13 + -0x75];
      lifetime_00 = (&this->func)[lVar13];
      if (lifetime_00 != lifetime) {
        if (lifetime_00 == (Func *)0x0 || lifetime != (Func *)0x0) {
          if ((((lifetime != (Func *)0x0) &&
               (((lifetime->lazyBailoutProperties).
                 super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 .bucketCount & 1) != 0)) &&
              (bVar5 = StackSym::IsConst((StackSym *)lifetime->m_alloc), !bVar5)) &&
             (uVar14 = *(uint32 *)((long)&lifetime->propertiesWrittenTo + 4),
             uVar8 = IR::Instr::GetNumber(&labelInstr->super_Instr), uVar8 < uVar14)) {
            if ((local_31 != false) && (bVar4 == false)) {
              InsertAirlock(this,branchInstr,labelInstr);
              local_50 = (labelInstr->super_Instr).m_prev;
              bVar4 = true;
              local_48 = labelInstr;
            }
            ReconcileRegContent(this,branchRegContent,(Lifetime **)thrashedRegs.word,branchInstr,
                                labelInstr,(Lifetime *)lifetime,(char)lVar13 + 0x8b,&local_70,
                                &local_48->super_Instr,local_50);
          }
          if (lifetime_00 != (Func *)0x0) goto LAB_0053785f;
        }
        else {
          uVar14 = *(uint *)&lifetime_00->propertiesWrittenTo;
          uVar8 = IR::Instr::GetNumber(&branchInstr->super_Instr);
          if ((uVar14 <= uVar8) || ((labelInstr->super_Instr).m_opcode != GeneratorBailInLabel)) {
LAB_0053785f:
            bVar5 = StackSym::IsConst((StackSym *)lifetime_00->m_alloc);
            if ((!bVar5) &&
               (uVar14 = *(uint *)&lifetime_00->propertiesWrittenTo,
               uVar8 = IR::Instr::GetNumber(&branchInstr->super_Instr), uVar14 <= uVar8)) {
              if ((local_31 != false) && (bVar4 == false)) {
                InsertAirlock(this,branchInstr,labelInstr);
                local_50 = (labelInstr->super_Instr).m_prev;
                bVar4 = true;
                local_48 = labelInstr;
              }
              ReconcileRegContent(this,branchRegContent,(Lifetime **)thrashedRegs.word,branchInstr,
                                  labelInstr,(Lifetime *)lifetime_00,(char)lVar13 + 0x8b,&local_70,
                                  &local_48->super_Instr,local_50);
            }
          }
        }
      }
    }
    local_80 = local_48;
    local_78 = local_50;
    local_32 = bVar4;
  }
  pLVar12 = local_80;
  if ((local_32 & 1U) != 0) {
    pIVar9 = (local_80->super_Instr).m_prev;
    IVar1 = pIVar9->m_kind;
    if ((((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) &&
        ((IVar1 = (local_80->super_Instr).m_kind, IVar1 == InstrKindProfiledLabel ||
         (IVar1 == InstrKindLabel)))) &&
       ((pLVar11 = IR::Instr::AsLabelInstr(pIVar9), (pLVar11->field_0x78 & 2) != 0 &&
        (pLVar11 = IR::Instr::AsLabelInstr(&pLVar12->super_Instr), (pLVar11->field_0x78 & 2) == 0)))
       ) {
      pLVar11 = IR::Instr::AsLabelInstr((pLVar12->super_Instr).m_prev);
      if ((pLVar11->field_0x78 & 2) != 0) {
        pLVar11 = IR::Instr::AsLabelInstr((pLVar12->super_Instr).m_prev);
        pLVar11->field_0x78 = pLVar11->field_0x78 | 0x20;
      }
      pLVar12 = IR::Instr::AsLabelInstr((pLVar12->super_Instr).m_prev);
      pLVar12->field_0x78 = pLVar12->field_0x78 & 0xfd;
    }
  }
  return;
}

Assistant:

void
LinearScan::InsertSecondChanceCompensation(Lifetime ** branchRegContent, Lifetime **labelRegContent,
                                           IR::BranchInstr *branchInstr, IR::LabelInstr *labelInstr)
{
    IR::Instr *prevInstr = branchInstr->GetPrevRealInstrOrLabel();
    bool needsAirlock = branchInstr->IsConditional() || (prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->IsConditional()) || branchInstr->IsMultiBranch();
    bool hasAirlock = false;
    IR::Instr *insertionInstr = branchInstr;
    IR::Instr *insertionStartInstr = branchInstr->m_prev;
    // For loop back-edge, we want to keep the insertionStartInstr before the branch as spill need to happen on all paths
    // Pass a dummy instr address to airLockBlock insertion code.
    BitVector thrashedRegs(0);
    bool isLoopBackEdge = (this->regContent == branchRegContent);
    Lifetime * tmpRegContent[RegNumCount];
    Lifetime **regContent = this->regContent;

    if (isLoopBackEdge)
    {
        Loop *loop = labelInstr->GetLoop();

        js_memcpy_s(&tmpRegContent, (RegNumCount * sizeof(Lifetime *)), this->regContent, sizeof(this->regContent));

        branchRegContent = tmpRegContent;
        regContent = tmpRegContent;

#if defined(_M_IX86) || defined(_M_X64)
        // Insert XCHG to avoid some conflicts for int regs
        // Note: no XCHG on ARM or SSE2.  We could however use 3 XOR on ARM...
        this->AvoidCompensationConflicts(labelInstr, branchInstr, labelRegContent, branchRegContent,
                                         &insertionInstr, &insertionStartInstr, needsAirlock, &hasAirlock);
#endif


        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // 1.  Insert Stores
            //          Lifetime starts before the loop
            //          Lifetime was re-allocated within the loop (i.e.: a load was most likely inserted)
            //          Lifetime is live on back-edge and has unsaved defs.

            if (lifetime && lifetime->start < labelInstr->GetNumber() && lifetime->lastAllocationStart > labelInstr->GetNumber()
                && (labelInstr->GetLoop()->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id))
                && !lifetime->defList.Empty())
            {
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                // If the lifetime was second chance allocated inside the loop, there might
                // be spilled loads of this symbol in the loop.  Insert the stores.
                // We don't need to do this if the lifetime was re-allocated before the loop.
                //
                // Note that reg may not be equal to lifetime->reg because of inserted XCHG...
                this->InsertStores(lifetime, lifetime->reg, insertionStartInstr);
            }

            if (lifetime == labelLifetime)
            {
                continue;
            }

            // 2.   MOV labelReg/MEM, branchReg
            //          Move current register to match content at the top of the loop
            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                // MOV ESI, EAX
                // MOV EDI, ECX
                // MOV ECX, ESI
                // MOV EAX, EDI <<<
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }

            // 2.   MOV labelReg, MEM
            //          Lifetime was in a reg at the top of the loop but is spilled right now.
            if (labelLifetime && labelLifetime->isSpilled && !labelLifetime->sym->IsConst() && labelLifetime->end >= branchInstr->GetNumber())
            {
                if (!loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id))
                {
                    continue;
                }
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_BITSET_IN_UNITBV;

        // 3.   MOV labelReg, MEM
        //          Finish up reloading lifetimes needed at the top.  #2 only handled secondChanceRegs.

        FOREACH_REG(reg)
        {
            // Handle lifetimes in a register at the top of the loop, but not currently.
            Lifetime *labelLifetime = labelRegContent[reg];
            if (labelLifetime && !labelLifetime->sym->IsConst() && labelLifetime != branchRegContent[reg] && !thrashedRegs.Test(reg)
                && (loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id)))
            {
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                            labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;

        if (hasAirlock)
        {
            loop->regAlloc.hasAirLock = true;
        }
    }
    else
    {
        //
        // Non-loop-back-edge merge
        //
        FOREACH_REG(reg)
        {
            Lifetime *branchLifetime = branchRegContent[reg];
            Lifetime *lifetime = regContent[reg];

            if (lifetime == branchLifetime)
            {
                continue;
            }

            // Allow us to properly insert compensation code for symbols whose lifetimes start after the generator jump table
            // The GeneratorBailInLabel will have 2 edges in: one from the normal flow, one straight from the generator jump table
            if (!branchLifetime && lifetime && lifetime->start > branchInstr->GetNumber() && labelInstr->m_opcode == Js::OpCode::GeneratorBailInLabel)
            {
                continue;
            }

            if (branchLifetime && branchLifetime->isSpilled && !branchLifetime->sym->IsConst() && branchLifetime->end > labelInstr->GetNumber())
            {
                // The lifetime was in a reg at the branch and is now spilled.  We need a store on this path.
                //
                //  MOV  MEM, branch_REG
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          branchLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
            if (lifetime && !lifetime->sym->IsConst() && lifetime->start <= branchInstr->GetNumber())
            {
                // MOV  label_REG, branch_REG / MEM
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;
    }

    if (hasAirlock)
    {
        // Fix opHelper on airlock label.
        if (insertionInstr->m_prev->IsLabelInstr() && insertionInstr->IsLabelInstr())
        {
            if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper && !insertionInstr->AsLabelInstr()->isOpHelper)
            {
                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Currently we would mark this block as a non-helper, but that makes
                // this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper)
                {
                    insertionInstr->m_prev->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                insertionInstr->m_prev->AsLabelInstr()->isOpHelper = false;
            }
        }
    }
}